

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

void Abc_NtkDumpVariableOrder(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  FILE *__stream;
  long lVar2;
  
  pvVar1 = Abc_NtkGlobalBddMan(pNtk);
  __stream = fopen("order.txt","wb");
  for (lVar2 = 0; lVar2 < *(int *)((long)pvVar1 + 0x88); lVar2 = lVar2 + 1) {
    fprintf(__stream,"%d ",(ulong)*(uint *)(*(long *)((long)pvVar1 + 0x148) + lVar2 * 4));
  }
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkDumpVariableOrder( Abc_Ntk_t * pNtk )
{
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    FILE * pFile = fopen( "order.txt", "wb" ); int i;
    for ( i = 0; i < dd->size; i++ )
        fprintf( pFile, "%d ", dd->invperm[i] );
    fprintf( pFile, "\n" );
    fclose( pFile );
}